

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O3

bool TestComparisons(void)

{
  bool bVar1;
  
  bVar1 = TestComparisonsF<Counter<unsigned_long,64u>>();
  if (bVar1) {
    bVar1 = TestComparisonsF<Counter<unsigned_long,48u>>();
    if (bVar1) {
      bVar1 = TestComparisonsF<Counter<unsigned_int,24u>>();
      if (bVar1) {
        bVar1 = TestComparisonsF<Counter<unsigned_short,16u>>();
        if (bVar1) {
          bVar1 = TestComparisonsF<Counter<unsigned_short,10u>>();
          if (bVar1) {
            bVar1 = TestComparisonsF<Counter<unsigned_char,8u>>();
            if (bVar1) {
              bVar1 = TestComparisonsF<Counter<unsigned_char,4u>>();
              return bVar1;
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool TestComparisons()
{
    TEST_CHECK(TestComparisonsF<Counter64>());
    TEST_CHECK(TestComparisonsF<Counter48>());
    TEST_CHECK(TestComparisonsF<Counter32>());
    TEST_CHECK(TestComparisonsF<Counter24>());
    TEST_CHECK(TestComparisonsF<Counter16>());
    TEST_CHECK(TestComparisonsF<Counter10>());
    TEST_CHECK(TestComparisonsF<Counter8>());
    TEST_CHECK(TestComparisonsF<Counter4>());
    return true;
}